

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AddEnvVar
               (cmGeneratedFileStream *fout,char *envVar,cmLocalGenerator *lg)

{
  cmMakefile *this;
  char *pcVar1;
  cmState *this_00;
  char *pcVar2;
  cmake *pcVar3;
  long lVar4;
  ostream *poVar5;
  allocator local_91;
  string valueToUse;
  string local_70;
  string cacheEntryName;
  
  this = lg->Makefile;
  pcVar1 = getenv(envVar);
  std::__cxx11::string::string
            ((string *)&cacheEntryName,"CMAKE_ECLIPSE_ENVVAR_",(allocator *)&valueToUse);
  std::__cxx11::string::append((char *)&cacheEntryName);
  this_00 = cmLocalGenerator::GetState(lg);
  pcVar2 = cmState::GetInitializedCacheValue(this_00,&cacheEntryName);
  valueToUse._M_dataplus._M_p = (pointer)&valueToUse.field_2;
  valueToUse._M_string_length = 0;
  valueToUse.field_2._M_local_buf[0] = '\0';
  if (pcVar1 == (char *)0x0 && pcVar2 == (char *)0x0) {
LAB_00315dff:
    std::__cxx11::string::assign((char *)&valueToUse);
  }
  else {
    if (pcVar1 == (char *)0x0 || pcVar2 != (char *)0x0) {
      if (pcVar2 != (char *)0x0 && pcVar1 == (char *)0x0) goto LAB_00315dff;
      std::__cxx11::string::assign((char *)&valueToUse);
      lVar4 = std::__cxx11::string::find((char *)&valueToUse,(ulong)pcVar1);
      if (lVar4 != -1) goto LAB_00315ebf;
      std::__cxx11::string::assign((char *)&valueToUse);
      cmMakefile::AddCacheDefinition
                (this,&cacheEntryName,valueToUse._M_dataplus._M_p,cacheEntryName._M_dataplus._M_p,
                 STRING,true);
      pcVar3 = cmMakefile::GetCMakeInstance(this);
      pcVar1 = cmLocalGenerator::GetBinaryDirectory(lg);
      std::__cxx11::string::string((string *)&local_70,pcVar1,&local_91);
      cmake::SaveCache(pcVar3,&local_70);
    }
    else {
      std::__cxx11::string::assign((char *)&valueToUse);
      cmMakefile::AddCacheDefinition
                (this,&cacheEntryName,valueToUse._M_dataplus._M_p,cacheEntryName._M_dataplus._M_p,
                 STRING,true);
      pcVar3 = cmMakefile::GetCMakeInstance(this);
      pcVar1 = cmLocalGenerator::GetBinaryDirectory(lg);
      std::__cxx11::string::string((string *)&local_70,pcVar1,&local_91);
      cmake::SaveCache(pcVar3,&local_70);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
LAB_00315ebf:
  if (valueToUse._M_string_length != 0) {
    poVar5 = std::operator<<((ostream *)fout,envVar);
    poVar5 = std::operator<<(poVar5,"=");
    poVar5 = std::operator<<(poVar5,(string *)&valueToUse);
    std::operator<<(poVar5,"|");
  }
  std::__cxx11::string::~string((string *)&valueToUse);
  std::__cxx11::string::~string((string *)&cacheEntryName);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(cmGeneratedFileStream& fout,
                                            const char* envVar,
                                            cmLocalGenerator* lg)
{
  cmMakefile* mf = lg->GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  const char* envVarValue = getenv(envVar);

  std::string cacheEntryName = "CMAKE_ECLIPSE_ENVVAR_";
  cacheEntryName += envVar;
  const char* cacheValue = lg->GetState()->GetInitializedCacheValue(
                                                       cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (envVarValue==0 && cacheValue==0)
    {
    // nothing known, do nothing
    valueToUse = "";
    }
  else if (envVarValue!=0 && cacheValue==0)
    {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                           cacheEntryName.c_str(), cmState::STRING,
                           true);
    mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
    }
  else if (envVarValue==0 && cacheValue!=0)
    {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = cacheValue;
    }
  else
    {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos)
      {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                             cacheEntryName.c_str(), cmState::STRING,
                             true);
      mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
      }
    }

  if (!valueToUse.empty())
    {
    fout << envVar << "=" << valueToUse << "|";
    }
}